

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

fy_anchor * fy_document_lookup_anchor_by_token(fy_document *fyd,fy_token *anchor)

{
  fy_anchor *pfVar1;
  int iVar2;
  fy_anchor *pfVar3;
  char *pcVar4;
  fy_input *pfVar5;
  size_t sVar6;
  size_t sVar7;
  fy_anchor *pfVar8;
  int iVar9;
  fy_anchor_list *pfVar10;
  fy_anchor *pfVar11;
  size_t text_len;
  size_t anchor_len;
  size_t local_48;
  char *local_40;
  size_t local_38;
  
  if (anchor != (fy_token *)0x0 && fyd != (fy_document *)0x0) {
    if ((fyd->axl != (fy_accel *)0x0) && (fyd->naxl != (fy_accel *)0x0)) {
      pfVar3 = fy_document_accel_lookup_anchor_by_token(fyd,anchor);
      if (pfVar3 == (fy_anchor *)0x0) {
        return (fy_anchor *)0x0;
      }
      if ((pfVar3->field_0x20 & 1) == 0) {
        return pfVar3;
      }
    }
    local_40 = fy_token_get_text(anchor,&local_38);
    if (local_40 != (char *)0x0) {
      pfVar10 = &fyd->anchors;
      pfVar11 = (fy_anchor *)0x0;
      iVar9 = 0;
      pfVar3 = (fy_anchor *)pfVar10;
      while( true ) {
        pfVar8 = (fy_anchor *)(pfVar3->node).next;
        pfVar3 = (fy_anchor *)0x0;
        if (pfVar8 != (fy_anchor *)pfVar10) {
          pfVar3 = pfVar8;
        }
        if (pfVar3 == (fy_anchor *)0x0) break;
        pcVar4 = fy_anchor_get_text(pfVar3,&local_48);
        if (pcVar4 == (char *)0x0) {
          return (fy_anchor *)0x0;
        }
        if (local_38 == local_48) {
          iVar2 = bcmp(local_40,pcVar4,local_38);
          if (iVar2 == 0) {
            pfVar11 = pfVar3;
          }
          iVar9 = iVar9 + (uint)(iVar2 == 0);
        }
      }
      if (iVar9 != 0) {
        if (iVar9 == 1) {
          return pfVar11;
        }
        pfVar3 = (fy_anchor *)(pfVar10->_lh).next;
        if (pfVar3 == (fy_anchor *)pfVar10) {
          pfVar3 = (fy_anchor *)0x0;
        }
        pfVar8 = (fy_anchor *)0x0;
        do {
          if (pfVar3 == (fy_anchor *)0x0) {
            if (pfVar8 != (fy_anchor *)0x0) {
              return pfVar8;
            }
            return pfVar11;
          }
          if (pfVar3->anchor == (fy_token *)0x0) {
            pfVar5 = (fy_input *)0x0;
          }
          else {
            pfVar5 = (pfVar3->anchor->handle).fyi;
          }
          if (pfVar5 == (anchor->handle).fyi) {
            pcVar4 = fy_anchor_get_text(pfVar3,&local_48);
            if (pcVar4 == (char *)0x0) {
              return (fy_anchor *)0x0;
            }
            if ((local_38 == local_48) && (iVar9 = bcmp(local_40,pcVar4,local_38), iVar9 == 0)) {
              sVar6 = fy_token_start_pos(pfVar3->anchor);
              sVar7 = fy_token_start_pos(anchor);
              if (sVar6 < sVar7) {
                pfVar8 = pfVar3;
              }
            }
          }
          pfVar1 = (fy_anchor *)(pfVar3->node).next;
          pfVar3 = (fy_anchor *)0x0;
          if (pfVar1 != (fy_anchor *)pfVar10) {
            pfVar3 = pfVar1;
          }
        } while( true );
      }
    }
  }
  return (fy_anchor *)0x0;
}

Assistant:

struct fy_anchor *
fy_document_lookup_anchor_by_token(struct fy_document *fyd,
                                   struct fy_token *anchor) {
    struct fy_anchor *fya, *fya_found, *fya_found2;
    struct fy_anchor_list *fyal;
    const char *anchor_text, *text;
    size_t anchor_len, text_len;
    int count;

    if (!fyd || !anchor)
        return NULL;

    /* first try direct match (it's faster and the common case) */
    if (fy_document_is_accelerated(fyd)) {
        fya = fy_document_accel_lookup_anchor_by_token(fyd, anchor);
        if (!fya)
            return NULL;

        /* single anchor? return it */
        if (!fya->multiple)
            return fya;

        /* multiple anchors, fall-through */
    }

    anchor_text = fy_token_get_text(anchor, &anchor_len);
    if (!anchor_text)
        return NULL;

    fyal = &fyd->anchors;

    /* first pass, try with a single match */
    count = 0;
    fya_found = NULL;
    for (fya = fy_anchor_list_head(fyal); fya; fya = fy_anchor_next(fyal, fya)) {
        text = fy_anchor_get_text(fya, &text_len);
        if (!text)
            return NULL;

        if (anchor_len == text_len && !memcmp(anchor_text, text, anchor_len)) {
            count++;
            fya_found = fya;
        }
    }

    /* not found */
    if (!count)
        return NULL;

    /* single one? fine */
    if (count == 1)
        return fya_found;

    /* multiple ones, must pick the one that's the last one before
	 * the requesting token */
    /* fyd_notice(fyd, "multiple anchors for %.*s", (int)anchor_len, anchor_text); */

    /* only try the ones on the same input
	 * we don't try to cover the case where the label is referenced
	 * by other constructed documents
	 */
    fya_found2 = NULL;
    for (fya = fy_anchor_list_head(fyal); fya; fya = fy_anchor_next(fyal, fya)) {

        /* only on the same input */
        if (fy_token_get_input(fya->anchor) != fy_token_get_input(anchor))
            continue;

        text = fy_anchor_get_text(fya, &text_len);
        if (!text)
            return NULL;

        if (anchor_len == text_len && !memcmp(anchor_text, text, anchor_len) &&
            fy_token_start_pos(fya->anchor) < fy_token_start_pos(anchor)) {
            fya_found2 = fya;
        }
    }

    /* just return the one find earlier */
    if (!fya_found2)
        return fya_found;

    /* return the one that was the latest */
    return fya_found2;
}